

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoPrint(Gia_IsoMan_t *p,int Iter,abctime Time)

{
  undefined4 in_register_00000034;
  
  printf("Iter %4d :  ",CONCAT44(in_register_00000034,Iter));
  printf("Entries =%8d.  ",(ulong)(uint)p->nEntries);
  printf("Uniques =%8d.  ",(ulong)(uint)p->nUniques);
  printf("Singles =%8d.  ",(ulong)(uint)p->nSingles);
  printf("%9.2f sec",(double)((float)Time / 1e+06));
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void Gia_IsoPrint( Gia_IsoMan_t * p, int Iter, abctime Time )
{
    printf( "Iter %4d :  ", Iter );
    printf( "Entries =%8d.  ", p->nEntries );
//    printf( "Classes =%8d.  ", Vec_IntSize(p->vClasses)/2 );
    printf( "Uniques =%8d.  ", p->nUniques );
    printf( "Singles =%8d.  ", p->nSingles );
    printf( "%9.2f sec", (float)(Time)/(float)(CLOCKS_PER_SEC) );
    printf( "\n" );
    fflush( stdout );
}